

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O0

void __thiscall QTextHtmlParserNode::QTextHtmlParserNode(QTextHtmlParserNode *this)

{
  QBrush *pQVar1;
  QBrush *pQVar2;
  QBrush *in_RDI;
  int i;
  QBrush *local_18;
  int local_c;
  
  QString::QString((QString *)0x85952c);
  QString::QString((QString *)0x85953a);
  QList<QString>::QList((QList<QString> *)0x859548);
  *(undefined4 *)
   &in_RDI[9].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = 0;
  QList<int>::QList((QList<int> *)0x85955d);
  *(undefined4 *)
   &in_RDI[0xd].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = 0xffffffff;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)0x859572);
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)0x859583);
  *(ushort *)
   &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       *(ushort *)
        &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl & 0xfffc;
  *(ushort *)
   &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       *(ushort *)
        &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl & 0xfffb;
  *(ushort *)
   &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       *(ushort *)
        &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl & 0xfff7;
  *(ushort *)
   &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       *(ushort *)
        &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl & 0xffef;
  *(ushort *)
   &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       *(ushort *)
        &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl & 0xffdf;
  *(ushort *)
   &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       *(ushort *)
        &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl & 0xffbf;
  *(ushort *)
   &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       *(ushort *)
        &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl & 0xff7f;
  *(ushort *)
   &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       *(ushort *)
        &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl & 0xfeff;
  *(ushort *)
   &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       *(ushort *)
        &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl & 0xf1ff | 0x200;
  *(ushort *)
   &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       *(ushort *)
        &in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl & 0xefff;
  *(undefined4 *)
   ((long)&in_RDI[0x12].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 4) = 0;
  *(undefined4 *)
   &in_RDI[0x13].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = 1;
  QString::QString((QString *)0x859684);
  QString::QString((QString *)0x859695);
  QString::QString((QString *)0x8596a6);
  QString::QString((QString *)0x8596b7);
  in_RDI[0x20].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)0xbff0000000000000;
  in_RDI[0x21].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)0xbff0000000000000;
  QTextLength::QTextLength((QTextLength *)(in_RDI + 0x22));
  QTextLength::QTextLength((QTextLength *)(in_RDI + 0x24));
  in_RDI[0x26].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)0x0;
  *(undefined4 *)
   &in_RDI[0x27].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = 1;
  *(undefined4 *)
   ((long)&in_RDI[0x27].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 4) = 1;
  in_RDI[0x28].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)0x4000000000000000;
  in_RDI[0x29].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)0x0;
  pQVar2 = in_RDI + 0x32;
  pQVar1 = in_RDI + 0x2e;
  do {
    local_18 = pQVar1;
    QBrush::QBrush(local_18);
    pQVar1 = local_18 + 1;
  } while (local_18 + 1 != pQVar2);
  QBrush::QBrush(in_RDI,(GlobalColor)((ulong)local_18 >> 0x20),(BrushStyle)local_18);
  *(undefined4 *)
   &in_RDI[0x35].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = 10;
  *(undefined1 *)
   ((long)&in_RDI[0x35].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 4) = 0;
  *(undefined4 *)
   &in_RDI[0x36].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = 0xffffffff;
  *(undefined4 *)
   ((long)&in_RDI[0x36].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 4) = 0;
  *(undefined4 *)
   &in_RDI[0x37].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = 0xffffffff;
  *(undefined4 *)
   &in_RDI[0x39].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = 0;
  *(undefined4 *)
   &in_RDI[0x38].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = 0;
  *(undefined4 *)
   ((long)&in_RDI[0x37].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 4) = 0;
  *(undefined4 *)
   ((long)&in_RDI[0x38].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 4) = 0;
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    *(undefined4 *)
     ((long)&in_RDI[0x32].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + (long)local_c * 4) = 0;
    in_RDI[(long)local_c + 0x2a].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
    _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)0x0;
    QBrush::operator=(in_RDI,(BrushStyle)((ulong)local_18 >> 0x20));
  }
  return;
}

Assistant:

QTextHtmlParserNode::QTextHtmlParserNode()
    : parent(0), id(Html_unknown),
      cssFloat(QTextFrameFormat::InFlow), hasOwnListStyle(false), hasOwnLineHeightType(false), hasLineHeightMultiplier(false),
      hasCssListIndent(false), isEmptyParagraph(false), isTextFrame(false), isRootFrame(false),
      displayMode(QTextHtmlElement::DisplayInline), hasHref(false),
      listStyle(QTextListFormat::ListStyleUndefined), imageWidth(-1), imageHeight(-1), tableBorder(0),
      tableCellRowSpan(1), tableCellColSpan(1), tableCellSpacing(2), tableCellPadding(0),
      borderBrush(Qt::darkGray), borderStyle(QTextFrameFormat::BorderStyle_Outset),
      borderCollapse(false),
      userState(-1), cssListIndent(0), wsm(WhiteSpaceModeUndefined)
{
    margin[QTextHtmlParser::MarginLeft] = 0;
    margin[QTextHtmlParser::MarginRight] = 0;
    margin[QTextHtmlParser::MarginTop] = 0;
    margin[QTextHtmlParser::MarginBottom] = 0;

    for (int i = 0; i < 4; ++i) {
        tableCellBorderStyle[i] = QTextFrameFormat::BorderStyle_None;
        tableCellBorder[i] = 0;
        tableCellBorderBrush[i] = Qt::NoBrush;
    }
}